

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

void printstack(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  uint local_14;
  int n;
  int i;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  for (local_14 = 1; (int)local_14 <= iVar1; local_14 = local_14 + 1) {
    pcVar2 = luaL_tolstring(L,local_14,(size_t *)0x0);
    printf("%3d: %s\n",(ulong)local_14,pcVar2);
    lua_settop(L,-2);
  }
  printf(anon_var_dwarf_1578f + 5);
  return;
}

Assistant:

static void printstack (lua_State *L) {
  int i;
  int n = lua_gettop(L);
  for (i = 1; i <= n; i++) {
    printf("%3d: %s\n", i, luaL_tolstring(L, i, NULL));
    lua_pop(L, 1);
  }
  printf("\n");
}